

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_stream_handler.c
# Opt level: O2

void ngx_stream_finalize_session(ngx_stream_session_t *s,ngx_uint_t rc)

{
  ngx_log_t *log;
  long lVar1;
  long lVar2;
  long lVar3;
  
  log = s->connection->log;
  if ((log->log_level & 0x400) != 0) {
    ngx_log_error_core(8,log,0,"finalize stream session: %i",rc);
  }
  s->status = rc;
  lVar1 = *(long *)((long)s->main_conf[ngx_stream_core_module.ctx_index] + 0x1c8);
  lVar2 = *(long *)((long)s->main_conf[ngx_stream_core_module.ctx_index] + 0x1d0);
  for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 1) {
    (**(code **)(lVar1 + lVar3 * 8))(s);
  }
  ngx_stream_close_connection(s->connection);
  return;
}

Assistant:

void
ngx_stream_finalize_session(ngx_stream_session_t *s, ngx_uint_t rc)
{
    ngx_log_debug1(NGX_LOG_DEBUG_STREAM, s->connection->log, 0,
                   "finalize stream session: %i", rc);

    s->status = rc;

    ngx_stream_log_session(s);

    ngx_stream_close_connection(s->connection);
}